

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  B local_d;
  undefined4 local_c;
  C c;
  
  local_c = 0;
  B::mem(&local_d);
  temp_func<int,C>((C *)&local_d,0x101170);
  temp_func<,C>((C *)&local_d,0x101160);
  return 0;
}

Assistant:

int
main()
{
    C c;
    c.mem();
    temp_func<int>(c, &C::mem3);
    temp_func<>(c, &C::mem3);
    (void)static_cast<void(C::*)(int)>(&C::mem3);
    (void)static_cast<void(C::*)(int)>(&C::mem);
    // temp_func<>(c, &C::mem);
    // temp_func<int>(mem_ptr(c, mem));
    // temp_func<>(mem_ptr(c, mem));
    // temp_func(mem_ptr(c, mem2));
    // temp_macro(c, mem, int);
    // temp_macro(c, mem);
    return 0;
}